

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

UBool ucase_addStringCaseClosure_63(UChar *s,int32_t length,USetAdder *sa)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint c;
  
  if (length - 4U < 0xfffffffe || s == (UChar *)0x0) {
    return '\0';
  }
  iVar2 = 0x49;
  iVar5 = 0x24;
  lVar8 = 0x335dd2;
  iVar4 = 0;
  while( true ) {
    lVar6 = 0;
    iVar7 = length + 1;
    do {
      if (*(ushort *)(lVar8 + lVar6) == 0) {
        iVar3 = 1;
        goto LAB_002aa3ff;
      }
      iVar3 = (uint)*(ushort *)((long)s + lVar6) - (uint)*(ushort *)(lVar8 + lVar6);
      if (iVar3 != 0) goto LAB_002aa3f4;
      lVar6 = lVar6 + 2;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
    if (length == 3) break;
    iVar3 = -(uint)(*(short *)(lVar8 + lVar6) != 0);
LAB_002aa3f4:
    if (iVar3 == 0) break;
LAB_002aa3ff:
    if (iVar3 < 0) {
      iVar2 = iVar5;
    }
    if (iVar3 >= 0) {
      iVar4 = iVar5 + 1;
    }
    iVar5 = (iVar4 + iVar2) / 2;
    lVar8 = (long)(iVar5 * 5) * 2 + 0x335c6a;
    if (iVar2 <= iVar4) {
      return '\0';
    }
  }
  iVar2 = 3;
  do {
    uVar1 = *(ushort *)(lVar8 + (long)iVar2 * 2);
    c = (uint)uVar1;
    if (uVar1 == 0) {
      return '\x01';
    }
    iVar4 = iVar2 + 1;
    if ((c & 0xfc00) == 0xd800) {
      c = (uint)uVar1 * 0x400 + (uint)*(ushort *)(lVar8 + (long)(iVar2 + 1) * 2) + 0xfca02400;
      iVar4 = iVar2 + 2;
    }
    iVar2 = iVar4;
    (*(code *)sa->add)(sa->set,c);
    ucase_addCaseClosure_63(c,sa);
  } while (iVar2 < 5);
  return '\x01';
}

Assistant:

U_CFUNC UBool U_EXPORT2
ucase_addStringCaseClosure(const UChar *s, int32_t length, const USetAdder *sa) {
    int32_t i, start, limit, result, unfoldRows, unfoldRowWidth, unfoldStringWidth;

    if(ucase_props_singleton.unfold==NULL || s==NULL) {
        return FALSE; /* no reverse case folding data, or no string */
    }
    if(length<=1) {
        /* the string is too short to find any match */
        /*
         * more precise would be:
         * if(!u_strHasMoreChar32Than(s, length, 1))
         * but this does not make much practical difference because
         * a single supplementary code point would just not be found
         */
        return FALSE;
    }

    const uint16_t *unfold=ucase_props_singleton.unfold;
    unfoldRows=unfold[UCASE_UNFOLD_ROWS];
    unfoldRowWidth=unfold[UCASE_UNFOLD_ROW_WIDTH];
    unfoldStringWidth=unfold[UCASE_UNFOLD_STRING_WIDTH];
    unfold+=unfoldRowWidth;

    if(length>unfoldStringWidth) {
        /* the string is too long to find any match */
        return FALSE;
    }

    /* do a binary search for the string */
    start=0;
    limit=unfoldRows;
    while(start<limit) {
        i=(start+limit)/2;
        const UChar *p=reinterpret_cast<const UChar *>(unfold+(i*unfoldRowWidth));
        result=strcmpMax(s, length, p, unfoldStringWidth);

        if(result==0) {
            /* found the string: add each code point, and its case closure */
            UChar32 c;

            for(i=unfoldStringWidth; i<unfoldRowWidth && p[i]!=0;) {
                U16_NEXT_UNSAFE(p, i, c);
                sa->add(sa->set, c);
                ucase_addCaseClosure(c, sa);
            }
            return TRUE;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return FALSE; /* string not found */
}